

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::Coap::Receive(Coap *this,Endpoint *aEndpoint,ByteArray *aBuf)

{
  shared_ptr<ot::commissioner::coap::Message> message;
  Error error;
  __shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2> _Stack_88;
  undefined1 local_78 [24];
  string local_60 [32];
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  pointer local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_40._0_4_ = kNone;
  local_38._M_p = (pointer)&local_28;
  local_30 = (pointer)0x0;
  local_28._M_local_buf[0] = '\0';
  Message::Deserialize((Message *)local_78,(Error *)local_40,aBuf);
  std::__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_88,
             (__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  Error::Error((Error *)(local_78 + 0x10),(Error *)local_40);
  ReceiveMessage(this,aEndpoint,(shared_ptr<ot::commissioner::coap::Message> *)&_Stack_88,
                 (Error *)(local_78 + 0x10));
  std::__cxx11::string::~string(local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

size_t Message::GetHeaderLength() const
{
    ByteArray buf;
    Error     error = Serialize(mHeader, buf);

    ASSERT(error == ErrorCode::kNone);
    return buf.size();
}